

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignumber.cpp
# Opt level: O2

BigNumber * __thiscall
BigNumber::addll(BigNumber *__return_storage_ptr__,BigNumber *this,longlong *other)

{
  string sStack_38;
  
  std::__cxx11::to_string(&sStack_38,*other);
  add(__return_storage_ptr__,this,(BigNumber *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

BigNumber BigNumber::addll(const long long &other) {
    return this->add(BigNumber(other));
}